

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void btreeReleaseAllCursorPages(BtCursor *pCur)

{
  short sVar1;
  long lVar2;
  
  sVar1 = pCur->iPage;
  if (-1 < sVar1) {
    lVar2 = -1;
    do {
      if (pCur->apPage[lVar2 + 1] != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(pCur->apPage[lVar2 + 1]->pDbPage);
        sVar1 = pCur->iPage;
      }
      pCur->apPage[lVar2 + 1] = (MemPage *)0x0;
      lVar2 = lVar2 + 1;
    } while (lVar2 < sVar1);
  }
  pCur->iPage = -1;
  return;
}

Assistant:

static void btreeReleaseAllCursorPages(BtCursor *pCur){
  int i;
  for(i=0; i<=pCur->iPage; i++){
    releasePage(pCur->apPage[i]);
    pCur->apPage[i] = 0;
  }
  pCur->iPage = -1;
}